

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

void update_last_qword_type(c2m_ctx_t c2m_ctx,type *type,MIR_type_t *qword_types,int n)

{
  MIR_type_t MVar1;
  mir_size_t mVar2;
  ulong uVar3;
  MIR_type_t local_40;
  MIR_type_t mir_type;
  size_t size;
  size_t last_size;
  int n_local;
  MIR_type_t *qword_types_local;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  mVar2 = type_size(c2m_ctx,type);
  if (n == 0) {
    __assert_fail("n != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                  ,0x85,"void update_last_qword_type(c2m_ctx_t, struct type *, MIR_type_t *, int)");
  }
  uVar3 = mVar2 & 7;
  if ((uVar3 != 0) && (n < 2)) {
    MVar1 = qword_types[n + -1];
    if ((uVar3 < 5) && (MVar1 == MIR_T_D)) {
      qword_types[n + -1] = MIR_T_F;
    }
    if ((uVar3 < 5) && (MVar1 == MIR_T_I64)) {
      if (uVar3 < 2) {
        local_40 = MIR_T_I8;
      }
      else {
        local_40 = MIR_T_I32;
        if (uVar3 < 3) {
          local_40 = MIR_T_I16;
        }
      }
      qword_types[n + -1] = local_40;
    }
  }
  return;
}

Assistant:

static void update_last_qword_type (c2m_ctx_t c2m_ctx, struct type *type,
                                    MIR_type_t qword_types[MAX_QWORDS], int n) {
  size_t last_size, size = type_size (c2m_ctx, type);
  MIR_type_t mir_type;

  assert (n != 0);
  if ((last_size = size % 8) == 0 || n > 1) return;
  mir_type = qword_types[n - 1];
  if (last_size <= 4 && mir_type == MIR_T_D) qword_types[n - 1] = MIR_T_F;
  if (last_size <= 4 && mir_type == MIR_T_I64)
    qword_types[n - 1] = last_size <= 1 ? MIR_T_I8 : last_size <= 2 ? MIR_T_I16 : MIR_T_I32;
}